

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolordialog.cpp
# Opt level: O3

void __thiscall QColorDialog::QColorDialog(QColorDialog *this,QColor *initial,QWidget *parent)

{
  QDialogPrivate *this_00;
  
  this_00 = (QDialogPrivate *)operator_new(0x3b0);
  QDialogPrivate::QDialogPrivate(this_00);
  *(undefined ***)&this_00->super_QWidgetPrivate = &PTR__QColorDialogPrivate_00800618;
  *(undefined8 *)&this_00[1].super_QWidgetPrivate.field_0x68 = 0;
  *(undefined4 *)&this_00[1].super_QWidgetPrivate.field_0x70 = 0;
  *(undefined2 *)&this_00[1].super_QWidgetPrivate.field_0x74 = 0xffff;
  *(undefined8 *)&this_00[1].super_QWidgetPrivate.field_0x76 = 0;
  QColorDialogOptions::create();
  this_00[1].super_QWidgetPrivate.graphicsEffect = (QGraphicsEffect *)0x0;
  this_00[1].super_QWidgetPrivate.extraPaintEngine = (QPaintEngine *)0x0;
  this_00[1].super_QWidgetPrivate.polished = (QMetaObject *)0x0;
  this_00[1].super_QWidgetPrivate.redirectDev = (QPaintDevice *)0x0;
  this_00[1].super_QWidgetPrivate.widgetItem = (QWidgetItemV2 *)0x0;
  QDialog::QDialog(&this->super_QDialog,this_00,parent,(WindowFlags)0x8003003);
  *(undefined ***)&(this->super_QDialog).super_QWidget = &PTR_metaObject_00800138;
  *(undefined ***)&(this->super_QDialog).super_QWidget.super_QPaintDevice =
       &PTR__QColorDialog_00800310;
  QColorDialogPrivate::init
            (*(QColorDialogPrivate **)&(this->super_QDialog).super_QWidget.field_0x8,
             (EVP_PKEY_CTX *)initial);
  return;
}

Assistant:

QColorDialog::QColorDialog(const QColor &initial, QWidget *parent)
    : QDialog(*new QColorDialogPrivate, parent, qcd_DefaultWindowFlags)
{
    Q_D(QColorDialog);
    d->init(initial);
}